

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBox.cpp
# Opt level: O0

CPoint * __thiscall CBBox::GetCenter(CPoint *__return_storage_ptr__,CBBox *this)

{
  char cVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  int iZ;
  int iY;
  int iX;
  CBBox *this_local;
  CPoint *Ret;
  
  sVar3 = this->m_iMinX;
  sVar4 = this->m_iMaxX;
  sVar5 = this->m_iMinY;
  sVar6 = this->m_iMaxY;
  cVar1 = this->m_cMinZ;
  cVar2 = this->m_cMaxZ;
  CPoint::CPoint(__return_storage_ptr__);
  CPoint::Initialize(__return_storage_ptr__,((int)sVar3 + (int)sVar4) / 2,
                     ((int)sVar5 + (int)sVar6) / 2,((int)cVar1 + (int)cVar2) / 2,(CWire *)0x0);
  return __return_storage_ptr__;
}

Assistant:

CPoint CBBox::GetCenter()
{
	int	iX	=	(m_iMinX+m_iMaxX)/2;
	int	iY	=	(m_iMinY+m_iMaxY)/2;
	int	iZ	=	(m_cMinZ+m_cMaxZ)/2;

	CPoint	Ret;
	Ret.Initialize(iX,iY,iZ,NULL);

	return	Ret;
}